

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O3

void __thiscall
SimpleString::split(SimpleString *this,SimpleString *delimiter,SimpleStringCollection *col)

{
  bool bVar1;
  size_t index;
  char *pcVar2;
  SimpleString *pSVar3;
  char *s1;
  size_t index_00;
  SimpleString local_50;
  SimpleString local_40;
  
  index = count(this,delimiter);
  bVar1 = endsWith(this,delimiter);
  SimpleStringCollection::allocate(col,!bVar1 + index);
  pcVar2 = this->buffer_;
  if (index != 0) {
    index_00 = 0;
    s1 = pcVar2;
    do {
      pcVar2 = StrStr(s1,delimiter->buffer_);
      pcVar2 = pcVar2 + 1;
      SimpleString(&local_40,s1);
      subString(&local_50,(size_t)&local_40,0);
      pSVar3 = SimpleStringCollection::operator[](col,index_00);
      copyBufferToNewInternalBuffer(pSVar3,&local_50);
      deallocateInternalBuffer(&local_50);
      deallocateInternalBuffer(&local_40);
      index_00 = index_00 + 1;
      s1 = pcVar2;
    } while (index != index_00);
  }
  if (!bVar1) {
    SimpleString(&local_50,pcVar2);
    pSVar3 = SimpleStringCollection::operator[](col,index);
    copyBufferToNewInternalBuffer(pSVar3,&local_50);
    deallocateInternalBuffer(&local_50);
  }
  return;
}

Assistant:

void SimpleString::split(const SimpleString& delimiter, SimpleStringCollection& col) const
{
    size_t num = count(delimiter);
    size_t extraEndToken = (endsWith(delimiter)) ? 0 : 1U;
    col.allocate(num + extraEndToken);

    const char* str = getBuffer();
    const char* prev;
    for (size_t i = 0; i < num; ++i) {
        prev = str;
        str = StrStr(str, delimiter.getBuffer()) + 1;
        col[i] = SimpleString(prev).subString(0, size_t (str - prev));
    }
    if (extraEndToken) {
        col[num] = str;
    }
}